

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_str_append(sqlite3_str *p,char *z,int N)

{
  int N_local;
  char *z_local;
  sqlite3_str *p_local;
  
  if (p->nChar + N < p->nAlloc) {
    if (N != 0) {
      p->nChar = N + p->nChar;
      memcpy(p->zText + (p->nChar - N),z,(long)N);
    }
  }
  else {
    enlargeAndAppend(p,z,N);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_str_append(sqlite3_str *p, const char *z, int N){
  assert( z!=0 || N==0 );
  assert( p->zText!=0 || p->nChar==0 || p->accError );
  assert( N>=0 );
  assert( p->accError==0 || p->nAlloc==0 );
  if( p->nChar+N >= p->nAlloc ){
    enlargeAndAppend(p,z,N);
  }else if( N ){
    assert( p->zText );
    p->nChar += N;
    memcpy(&p->zText[p->nChar-N], z, N);
  }
}